

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O1

void __thiscall Z80::OpCode_Next_MUL(Z80 *this)

{
  bool bVar1;
  Z80Reg ZVar2;
  int iVar3;
  char **p;
  char *message;
  int local_10 [4];
  
  if (DAT_0018d51c < 1) {
    message = "Z80N instructions are currently disabled";
  }
  else {
    local_10[2] = 0xffffffff;
    local_10[0] = -1;
    local_10[1] = -1;
    ZVar2 = GetRegister((char **)this);
    if (ZVar2 == Z80_UNK) {
      iVar3 = SkipBlanks(&lp);
      if (iVar3 == 0) {
        ZVar2 = Z80_UNK;
      }
      else {
        bVar1 = Options::noFakes(true);
        ZVar2 = -(uint)bVar1 | Z80_DE;
      }
    }
    if (ZVar2 == Z80_DE) {
LAB_00139f34:
      local_10[0] = 0xed;
      local_10[1] = 0x30;
      EmitBytes(local_10,true);
      return;
    }
    if (ZVar2 == Z80_D) {
      p = &lp;
      bVar1 = comma(&lp);
      if (bVar1) {
        ZVar2 = GetRegister(p);
        if (ZVar2 == Z80_E) goto LAB_00139f34;
      }
    }
    message = "Z80N MUL exist only with \"D,E\" arguments";
  }
  Error(message,bp,SUPPRESS);
  return;
}

Assistant:

static void OpCode_Next_MUL() {
		if (Options::syx.IsNextEnabled < 1) {
			Error("Z80N instructions are currently disabled", bp, SUPPRESS);
			return;
		}
		int e[3] { -1, -1, -1 };
		Z80Reg r1 = GetRegister(lp);
		if (Z80_UNK == r1 && SkipBlanks(lp) && !Options::noFakes()) {
			r1 = Z80_DE;	// "mul" without arguments is treated as "fake" "mul de"
		}
		// "mul de" and "mul d,e" are both valid syntax options
		if ((Z80_DE==r1) || (Z80_D==r1 && comma(lp) && Z80_E==GetRegister(lp))) {
			e[0]=0xED;
			e[1]=0x30;
		} else {
			Error("Z80N MUL exist only with \"D,E\" arguments", bp, SUPPRESS);
			return;
		}
		EmitBytes(e, true);
	}